

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

ParamIteratorInterface<char> * __thiscall
testing::internal::ValuesInIteratorRangeGenerator<char>::Iterator::Clone(Iterator *this)

{
  ParamIteratorInterface<char> *pPVar1;
  Iterator *in_stack_ffffffffffffffe8;
  Iterator *in_stack_fffffffffffffff0;
  
  pPVar1 = (ParamIteratorInterface<char> *)operator_new(0x20);
  Iterator(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  return pPVar1;
}

Assistant:

virtual ParamIteratorInterface<T>* Clone() const {
      return new Iterator(*this);
    }